

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> * __thiscall
testing::internal::
FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)>::With
          (MockSpec<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)>
           *__return_storage_ptr__,
          FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> *this,
          Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *m)

{
  tuple<testing::Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>_> local_38;
  Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *local_20;
  Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *m_local;
  FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *)this;
  this_local = (FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> *
               )__return_storage_ptr__;
  std::make_tuple<testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>const&>>
            (&local_38,m);
  MockSpec<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)>::MockSpec
            (__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>_>::~tuple
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }